

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O3

void __thiscall cppjit::builder::builder::builder(builder *this,string *kernel_name,bool verbose)

{
  pointer pcVar1;
  
  this->_vptr_builder = (_func_int **)&PTR___cxa_pure_virtual_0010ad80;
  (this->kernel_name)._M_dataplus._M_p = (pointer)&(this->kernel_name).field_2;
  pcVar1 = (kernel_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->kernel_name,pcVar1,pcVar1 + kernel_name->_M_string_length);
  this->verbose = verbose;
  this->do_cleanup = true;
  this->has_source_ = false;
  this->has_inline_source_ = false;
  (this->source)._M_dataplus._M_p = (pointer)&(this->source).field_2;
  (this->source)._M_string_length = 0;
  (this->source).field_2._M_local_buf[0] = '\0';
  (this->source_dir)._M_dataplus._M_p = (pointer)&(this->source_dir).field_2;
  (this->source_dir)._M_string_length = 0;
  (this->source_dir).field_2._M_local_buf[0] = '\0';
  (this->compile_dir)._M_dataplus._M_p = (pointer)&(this->compile_dir).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->compile_dir,"");
  this->compile_dir_created = false;
  this->kernel_library = (void *)0x0;
  return;
}

Assistant:

builder(const std::string &kernel_name, bool verbose = false)
      : kernel_name(kernel_name),
        verbose(verbose),
        do_cleanup(true),
        has_source_(false),
        has_inline_source_(false),
        // source_dir(DEFAULT_KERNEL_COMPILE_DIR),
        compile_dir(""),
        compile_dir_created(false),
        kernel_library(nullptr) {}